

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

int main(int argc,char **argv)

{
  khalfflag_t *pkVar1;
  char **ppcVar2;
  byte bVar3;
  byte bVar4;
  PlatformApi *pPVar5;
  kArray *pkVar6;
  _func_kString_ptr_KonohaContext_ptr_kArray_ptr_char_ptr_size_t_int *p_Var7;
  _func_void_KonohaContext_ptr_kArray_ptr_void_ptr *p_Var8;
  _func_kbool_t_KonohaContext_ptr_kNameSpace_ptr_char_ptr_ptr_KTraceInfo_ptr *p_Var9;
  KModuleInfo *pKVar10;
  _func_void_KonohaContext_ptr_KBuffer_ptr_char_ptr_size_t *p_Var11;
  _func_int_char_ptr *p_Var12;
  KRuntimeContextVar *pKVar13;
  _func_int_char_ptr_varargs *p_Var14;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var15;
  bool bVar16;
  char cVar17;
  int iVar18;
  char *pcVar19;
  KonohaContext *kctx;
  size_t sVar20;
  kString *pkVar21;
  kNameSpace *pkVar22;
  kfileline_t kVar23;
  uintptr_t uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  int option_index;
  KonohaFactory factory;
  ulong local_478;
  KBuffer local_468;
  kObject_conflict *local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  KClass *local_438;
  size_t local_430;
  long local_428;
  ulong local_420;
  KTraceInfo local_418;
  undefined1 local_400 [24];
  undefined8 local_3e8;
  undefined4 local_3e0;
  
  memset(local_400,0,0x3d0);
  pcVar19 = getenv("KONOHA_DEBUG");
  if (pcVar19 != (char *)0x0) {
    local_3e8 = 0x100000001;
    local_3e0 = 1;
  }
  KonohaFactory_SetDefaultFactory(local_400,PosixFactory,argc,argv);
  kctx = (KonohaContext *)KonohaFactory_CreateKonoha(local_400);
  local_418.baseStack = kctx->esp + 4;
  local_418.pline = 0;
  local_418.errorSymbol = 0;
  local_418.faultType = 0;
  do {
    local_468.m = (KGrowingArray *)((ulong)local_468.m & 0xffffffff00000000);
    iVar18 = getopt_long(argc,argv,"icqD:I:M:S:f:",long_options2,&local_468);
    if (iVar18 < 0x4d) {
      if (0x43 < iVar18) {
        if (iVar18 == 0x44) {
          CommandLine_Define(kctx,_optarg,&local_418);
        }
        else {
          if (iVar18 != 0x49) goto LAB_00102618;
          CommandLine_Import(kctx,_optarg,&local_418);
        }
        goto LAB_0010260c;
      }
      iVar27 = 3;
      if (iVar18 != -1) {
        if (iVar18 == 0x3f) goto LAB_0010260c;
LAB_00102618:
        kctx->platApi->exitStatus = 1;
        iVar27 = 1;
      }
    }
    else {
      if (iVar18 < 0x69) {
        if (iVar18 == 0x4d) {
          if ((_optarg != (char *)0x0) && (iVar18 = strcmp(_optarg,"OutputTest"), iVar18 == 0)) {
            pkVar1 = &kctx->stack->flag;
            *pkVar1 = *pkVar1 | 1;
            pPVar5 = kctx->platApi;
            pPVar5->verbose_debug = 0;
            pPVar5->verbose_sugar = 0;
            pPVar5->verbose_code = 0;
          }
        }
        else {
          if (iVar18 != 99) goto LAB_00102618;
          pkVar1 = &kctx->stack->flag;
          *pkVar1 = *pkVar1 | 4;
        }
      }
      else if (iVar18 == 0x69) {
        interactive_flag = '\x01';
        pkVar1 = &kctx->stack->flag;
        *pkVar1 = *pkVar1 | 2;
      }
      else {
        if (iVar18 != 0x71) goto LAB_00102618;
        fprintf(_stdout,"%s-%lu\n","3.0");
        (*kctx->platApi->exit_i)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/exec/command/command.c"
                   ,0xaa);
      }
LAB_0010260c:
      iVar27 = 0;
    }
    if (iVar27 != 0) {
      if (iVar27 == 3) {
        local_428 = (long)_optind;
        uVar26 = argc - _optind;
        ppcVar2 = argv + local_428;
        pkVar6 = kctx->stack->gcStack;
        local_430 = pkVar6->bytesize;
        local_468.m = (KGrowingArray *)0x5;
        local_438 = (*kctx->klib->KClass_Generics)
                              (kctx,*(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0
                               ,1,(kparamtype_t *)&local_468);
        local_458 = (*kctx->klib->new_kObject)(kctx,pkVar6,local_438,0);
        if (0 < (int)uVar26) {
          local_420 = (ulong)uVar26;
          uVar28 = 0;
          do {
            p_Var7 = kctx->klib->new_kString;
            p_Var8 = kctx->klib->kArray_Add;
            pcVar19 = ppcVar2[uVar28];
            sVar20 = strlen(pcVar19);
            pkVar21 = (*p_Var7)(kctx,pkVar6,pcVar19,sVar20,1);
            (*p_Var8)(kctx,(kArray *)local_458,pkVar21);
            uVar28 = uVar28 + 1;
          } while (local_420 != uVar28);
        }
        uVar28 = local_430 >> 3;
        local_468.m = (KGrowingArray *)0x1056b9;
        local_468.pos = (size_t)local_438->typeId;
        local_450 = 0;
        uStack_448 = 0;
        local_440 = 0;
        p_Var9 = kctx->klib->kNameSpace_LoadConstData;
        pkVar22 = (kNameSpace *)
                  (*kctx->klib->Knull)
                            (kctx,*(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58));
        (*p_Var9)(kctx,pkVar22,(char **)&local_468,&local_418);
        (*kctx->klib->kArray_Clear)(kctx,pkVar6,uVar28);
        if ((int)local_428 < argc) {
          Konoha_LoadScript(kctx,*ppcVar2);
        }
        else {
          interactive_flag = '\x01';
          pkVar1 = &kctx->stack->flag;
          *pkVar1 = *pkVar1 | 2;
        }
        if (interactive_flag == '\x01') {
          CommandLine_Import(kctx,"Konoha.Man",&local_418);
          (*kctx->platApi->printf_i)
                    ("Konoha alpha 3.0 (%s) (%s, %lu, %s)\n","Rome","93e091e6",0x1082b,"Apr 27 2025"
                    );
          (*kctx->platApi->printf_i)
                    ("[gcc %s]\n",
                     "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                    );
          (*kctx->platApi->printf_i)("modules:");
          pKVar10 = (kctx->platApi->ExecutionEngineModule).ExecutionEngineInfo;
          if ((pKVar10 != (KModuleInfo *)0x0) && (pKVar10->desc != (char *)0x0)) {
            (*kctx->platApi->printf_i)(" %s");
          }
          pKVar10 = (kctx->platApi->GCModule).GCInfo;
          if ((pKVar10 != (KModuleInfo *)0x0) && (pKVar10->desc != (char *)0x0)) {
            (*kctx->platApi->printf_i)(" %s");
          }
          pKVar10 = (kctx->platApi->ConsoleModule).ConsoleInfo;
          if ((pKVar10 != (KModuleInfo *)0x0) && (pKVar10->desc != (char *)0x0)) {
            (*kctx->platApi->printf_i)(" %s");
          }
          pKVar10 = (kctx->platApi->EventModule).EventInfo;
          if ((pKVar10 != (KModuleInfo *)0x0) && (pKVar10->desc != (char *)0x0)) {
            (*kctx->platApi->printf_i)(" %s");
          }
          pKVar10 = (kctx->platApi->I18NModule).I18NInfo;
          if ((pKVar10 != (KModuleInfo *)0x0) && (pKVar10->desc != (char *)0x0)) {
            (*kctx->platApi->printf_i)(" %s");
          }
          (*kctx->platApi->printf_i)("\n");
          (*kctx->klib->KBuffer_Init)(&kctx->stack->cwb,&local_468);
          kVar23 = (*kctx->klib->KfileId)(kctx,"(shell)",7,3,0xfffffffe);
          local_478 = kVar23 | 1;
          do {
            iVar18 = 2;
            lVar29 = 0;
            iVar27 = 1;
            do {
              pcVar19 = "    ";
              if (iVar27 == 1) {
                pcVar19 = ">>> ";
              }
              pcVar19 = (*kctx->platApi->readline_i)(pcVar19);
              if (pcVar19 == (char *)0x0) {
                (*kctx->klib->KBuffer_Free)(&local_468);
                bVar16 = true;
                iVar18 = 1;
              }
              else {
                if (1 < iVar27) {
                  (*kctx->klib->KBuffer_Write)(kctx,&local_468,"\n",1);
                }
                p_Var11 = kctx->klib->KBuffer_Write;
                sVar20 = strlen(pcVar19);
                (*p_Var11)(kctx,&local_468,pcVar19,sVar20);
                free(pcVar19);
                iVar30 = 0;
                pcVar19 = (*kctx->klib->KBuffer_text)(kctx,&local_468,0);
                uVar28 = (local_468.m)->bytesize - local_468.pos;
                if ((local_468.m)->bytesize != local_468.pos) {
                  iVar30 = 0;
                  uVar25 = 0;
                  do {
                    bVar3 = pcVar19[uVar25];
                    if (((bVar3 == 0x28) || (bVar3 == 0x7b)) || (bVar3 == 0x5b)) {
                      iVar30 = iVar30 + 1;
                    }
                    if (((bVar3 == 0x29) || (bVar3 == 0x7d)) || (bVar3 == 0x5d)) {
                      iVar30 = iVar30 + -1;
                    }
                    if (((bVar3 - 0x22 < 0x3f) &&
                        ((0x4000000000000021U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) != 0)) &&
                       ((pcVar19[uVar25 + 1] == bVar3 && (pcVar19[uVar25 + 2] == bVar3)))) {
                      uVar25 = uVar25 + 2;
                      if (uVar25 == 0) {
                        __assert_fail("i > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/include/konoha3/libcode/minishell.h"
                                      ,0x2e,"int CheckNode(const char *, size_t)");
                      }
                      while( true ) {
                        if (uVar28 <= uVar25) {
                          iVar30 = 1;
                          goto LAB_00102a93;
                        }
                        if ((((pcVar19[uVar25 - 1] != '\\') &&
                             (bVar4 = pcVar19[uVar25], bVar4 == bVar3)) &&
                            (pcVar19[uVar25 + 1] == bVar4)) && (pcVar19[uVar25 + 2] == bVar4))
                        break;
                        uVar25 = uVar25 + 1;
                      }
                      uVar25 = uVar25 + 2;
                    }
                    else {
                      uVar25 = uVar25 + 1;
                    }
                  } while (uVar25 < uVar28);
                }
LAB_00102a93:
                if (iVar30 < 1) {
                  bVar16 = true;
                  if (iVar30 < 0) {
                    (*kctx->platApi->printf_i)("(Cancelled)...\n");
                    (*kctx->klib->KBuffer_Free)(&local_468);
                  }
                }
                else {
                  lVar29 = lVar29 + 1;
                  iVar27 = iVar27 + 1;
                  bVar16 = false;
                }
              }
            } while (!bVar16);
            if ((local_468.m)->bytesize != local_468.pos) {
              p_Var12 = kctx->platApi->add_history_i;
              pcVar19 = (*kctx->klib->KBuffer_text)(kctx,&local_468,1);
              (*p_Var12)(pcVar19);
            }
            fflush(_stdout);
            if ((iVar18 != 1) && ((local_468.m)->bytesize != local_468.pos)) {
              pcVar19 = (*kctx->klib->KBuffer_text)(kctx,&local_468,1);
              cVar17 = Konoha_Eval(kctx,pcVar19,local_478);
              local_478 = local_478 + lVar29 + 1;
              (*kctx->klib->KBuffer_Free)(&local_468);
              if (cVar17 != '\0') {
                pKVar13 = kctx->stack;
                uVar26 = pKVar13->evalty;
                if (uVar26 != 0) {
                  pcVar19 = (kctx->share->classTable).field_1.bytebuf;
                  if ((*(byte *)(*(long *)(pcVar19 + (ulong)(uVar26 & 0xfffffff) * 8) + 100) & 2) ==
                      0) {
                    uVar26 = (((pKVar13->stack[pKVar13->evalidx].field_0.asObject)->h).ct)->typeId;
                  }
                  uVar26 = uVar26 & 0xfffffff;
                  (**(code **)(*(long *)(pcVar19 + (ulong)uVar26 * 8) + 0x28))
                            (kctx,pKVar13->stack + pKVar13->evalidx,0,&local_468);
                  fflush(_stdout);
                  p_Var14 = kctx->platApi->printf_i;
                  pkVar21 = KType_GetString(kctx,uVar26);
                  p_Var15 = ((pkVar21->h).ct)->unbox;
                  pkVar21 = KType_GetString(kctx,uVar26);
                  uVar24 = (*p_Var15)(kctx,(kObject_conflict *)pkVar21);
                  pcVar19 = (*kctx->klib->KBuffer_text)(kctx,&local_468,1);
                  (*p_Var14)("  (%s) %s\n",uVar24,pcVar19);
                  pKVar13->evalty = 0;
                }
                (*kctx->klib->KBuffer_Free)(&local_468);
              }
            }
          } while (iVar18 != 1);
          (*kctx->klib->KBuffer_Free)(&local_468);
          (*kctx->platApi->printf_i)("\n");
        }
      }
      iVar18 = Konoha_Destroy(kctx);
      return iVar18;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	struct KonohaFactory factory = {};
	if(getenv("KONOHA_DEBUG") != NULL) {
		factory.verbose_debug = 1;
		factory.verbose_sugar = 1;
		factory.verbose_code = 1;
	}
	KonohaFactory_SetDefaultFactory(&factory, PosixFactory, argc, argv);
	KonohaContext* konoha = KonohaFactory_CreateKonoha(&factory);
	Konoha_ParseCommandOption(konoha, argc, argv);
	return Konoha_Destroy(konoha);
}